

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2etest.cc
# Opt level: O2

void e2e_crash_recover_test(bool do_rollback)

{
  long *plVar1;
  fdb_status fVar2;
  time_t tVar3;
  storage_t *psVar4;
  char *pcVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  char *__format;
  ulong uVar9;
  bool bVar10;
  fdb_snapshot_info_t *markers;
  uint64_t num_markers;
  fdb_kvs_handle *snap_db;
  fdb_kvs_config kvs_config;
  idx_prams_t index_params;
  timeval __test_begin;
  fdb_kvs_info info;
  fdb_config fconfig;
  checkpoint_t verification_checkpoint;
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  tVar3 = time((time_t *)0x0);
  srand((uint)tVar3);
  rm_storage_fs();
  fdb_get_default_kvs_config();
  fdb_get_default_config();
  fconfig.flags = 1;
  fconfig.compaction_threshold = '\0';
  fconfig.durability_opt = '\x02';
  fconfig.purging_interval = 0x1e;
  gen_index_params(&index_params);
  memset(&verification_checkpoint,0,0x430);
  psVar4 = init_storage(&fconfig,&fconfig,&kvs_config,&index_params,&verification_checkpoint,true);
  iVar6 = 100;
  while (bVar10 = iVar6 != 0, iVar6 = iVar6 + -1, bVar10) {
    load_persons(psVar4);
    e2e_fdb_commit(psVar4->main,true);
  }
  fVar2 = fdb_get_all_snap_markers(psVar4->main,&markers,&num_markers);
  if (do_rollback) {
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
              ,0x4f0);
      e2e_crash_recover_test(bool)::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                    ,0x4f0,"void e2e_crash_recover_test(bool)");
    }
    lVar8 = 0x10;
    uVar9 = 0xfffffffffffffff6;
    while (uVar9 = uVar9 + 10, uVar9 < num_markers) {
      plVar1 = (long *)((long)&markers->marker + lVar8);
      lVar8 = lVar8 + 0xf0;
      fVar2 = fdb_rollback(&psVar4->all_docs,*(fdb_seqnum_t *)(*plVar1 + 8));
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                ,0x4f6);
        e2e_crash_recover_test(bool)::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                      ,0x4f6,"void e2e_crash_recover_test(bool)");
      }
    }
  }
  else {
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
              ,0x4fc);
      e2e_crash_recover_test(bool)::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                    ,0x4fc,"void e2e_crash_recover_test(bool)");
    }
    for (uVar9 = 0; uVar9 < num_markers; uVar9 = uVar9 + 10) {
      load_persons(psVar4);
    }
  }
  fdb_free_snap_markers(markers,num_markers);
  e2e_fdb_close(psVar4);
  corrupt_latest_superblock("e2edb_main");
  gen_index_params(&index_params);
  iVar6 = 0;
  memset(&verification_checkpoint,0,0x430);
  psVar4 = init_storage(&fconfig,&fconfig,&kvs_config,&index_params,&verification_checkpoint,true);
  do {
    if (iVar6 == 2) {
      e2e_fdb_shutdown(psVar4);
      memleak_end();
      if (do_rollback) {
        if ((e2e_crash_recover_test(bool)::__test_pass & 1) == 0) {
          __format = "%s PASSED\n";
        }
        else {
          __format = "%s FAILED\n";
        }
        pcVar5 = "TEST: e2e crash recover test with rollback";
      }
      else {
        if ((e2e_crash_recover_test(bool)::__test_pass & 1) == 0) {
          __format = "%s PASSED\n";
        }
        else {
          __format = "%s FAILED\n";
        }
        pcVar5 = "TEST: e2e crash recover test";
      }
      fprintf(_stderr,__format,pcVar5);
      return;
    }
    load_persons(psVar4);
    iVar7 = 100;
    while (bVar10 = iVar7 != 0, iVar7 = iVar7 + -1, bVar10) {
      load_persons(psVar4);
      e2e_fdb_commit(psVar4->main,true);
      fVar2 = fdb_get_kvs_info(psVar4->all_docs,&info);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                ,0x516);
        e2e_crash_recover_test(bool)::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                      ,0x516,"void e2e_crash_recover_test(bool)");
      }
      fdb_snapshot_open(psVar4->all_docs,&snap_db,info.last_seqnum);
      update_index(psVar4,true);
      verify_db(psVar4);
      fdb_kvs_close(snap_db);
    }
    iVar6 = iVar6 + 1;
  } while( true );
}

Assistant:

void e2e_crash_recover_test(bool do_rollback) {

    TEST_INIT();
    memleak_start();

    randomize();

    bool walflush = true;
    int i, n;
    int n_checkpoints =  2;

    rm_storage_fs();
    storage_t *st;
    checkpoint_t verification_checkpoint;
    idx_prams_t index_params;
    fdb_kvs_handle *snap_db;
    fdb_kvs_info info;
    fdb_status status;

    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_config fconfig = fdb_get_default_config();
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;
    fconfig.durability_opt = FDB_DRB_ASYNC;
    fconfig.purging_interval = 30; // retain deleted docs for iteration

    gen_index_params(&index_params);
    memset(&verification_checkpoint, 0, sizeof(checkpoint_t));
    st = init_storage(&fconfig, &fconfig, &kvs_config,
                      &index_params, &verification_checkpoint, walflush);

    for (i = 0; i < 100; ++i) {
        load_persons(st);
        e2e_fdb_commit(st->main, true);
    }

    fdb_seqnum_t seqno;
    uint64_t k, num_markers;
    fdb_snapshot_info_t *markers;

    if (do_rollback) {
        status = fdb_get_all_snap_markers(st->main, &markers,
                                          &num_markers);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        for (k = 0; k < num_markers; k += 10) {
            // rollback to each marker
            seqno = markers[k].kvs_markers[0].seqnum;
            status = fdb_rollback(&st->all_docs, seqno);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
        fdb_free_snap_markers(markers, num_markers);
    } else {
        status = fdb_get_all_snap_markers(st->main, &markers,
                                          &num_markers);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        for (k = 0; k < num_markers; k += 10) {
            load_persons(st);
        }
        fdb_free_snap_markers(markers, num_markers);
    }

    // close storage
    e2e_fdb_close(st);

    corrupt_latest_superblock(E2EDB_MAIN);

    // reopen storage
    gen_index_params(&index_params);
    memset(&verification_checkpoint, 0, sizeof(checkpoint_t));
    st = init_storage(&fconfig, &fconfig, &kvs_config,
                      &index_params, &verification_checkpoint, walflush);

    // run verifiable workload
    for (n = 0; n < n_checkpoints; ++n) {
        load_persons(st);
        for (i = 0; i < 100; ++i) {
            load_persons(st);
            e2e_fdb_commit(st->main, walflush);
            status = fdb_get_kvs_info(st->all_docs, &info);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            fdb_snapshot_open(st->all_docs, &snap_db, info.last_seqnum);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            update_index(st, true);
            verify_db(st);
            fdb_kvs_close(snap_db);
        }
    }

    // teardown
    e2e_fdb_shutdown(st);
    memleak_end();
    if (do_rollback) {
        TEST_RESULT("TEST: e2e crash recover test with rollback");
    } else {
        TEST_RESULT("TEST: e2e crash recover test");
    }
}